

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O3

int png_image_begin_read_from_file(png_imagep image,char *file_name)

{
  undefined1 *puVar1;
  png_controlp ppVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  char *error_message;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version == 1) {
    if (file_name == (char *)0x0) {
      error_message = "png_image_begin_read_from_file: invalid argument";
    }
    else {
      __stream = fopen(file_name,"rb");
      if (__stream != (FILE *)0x0) {
        iVar3 = png_image_read_init(image);
        if (iVar3 == 0) {
          fclose(__stream);
          return 0;
        }
        ppVar2 = image->opaque;
        ppVar2->png_ptr->io_ptr = __stream;
        puVar1 = &ppVar2->field_0x28;
        *puVar1 = *puVar1 | 2;
        iVar3 = png_safe_execute(image,png_image_read_header,image);
        return iVar3;
      }
      piVar4 = __errno_location();
      error_message = strerror(*piVar4);
    }
  }
  else {
    error_message = "png_image_begin_read_from_file: incorrect PNG_IMAGE_VERSION";
  }
  iVar3 = png_image_error(image,error_message);
  return iVar3;
}

Assistant:

int PNGAPI
png_image_begin_read_from_file(png_imagep image, const char *file_name)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file_name != NULL)
      {
         FILE *fp = fopen(file_name, "rb");

         if (fp != NULL)
         {
            if (png_image_read_init(image) != 0)
            {
               image->opaque->png_ptr->io_ptr = fp;
               image->opaque->owned_file = 1;
               return png_safe_execute(image, png_image_read_header, image);
            }

            /* Clean up: just the opened file. */
            (void)fclose(fp);
         }

         else
            return png_image_error(image, strerror(errno));
      }

      else
         return png_image_error(image,
             "png_image_begin_read_from_file: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_begin_read_from_file: incorrect PNG_IMAGE_VERSION");

   return 0;
}